

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.h
# Opt level: O2

void __thiscall
gimage::HighDynamicRangeFusion<float>::mulSaturationWeight
          (HighDynamicRangeFusion<float> *this,ImageFloat *wp,
          Image<float,_gimage::PixelTraits<float>_> *image,float max_value)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float *pfVar5;
  ulong uVar6;
  long i;
  ulong uVar7;
  int d;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  uVar1 = image->depth;
  pfVar5 = **wp->img;
  fVar9 = (float)(int)uVar1;
  uVar4 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  uVar6 = image->width;
  if (image->width < 1) {
    uVar6 = uVar4;
  }
  uVar3 = image->height;
  if (image->height < 1) {
    uVar3 = uVar4;
  }
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      fVar10 = 0.0;
      fVar11 = 0.0;
      for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
        fVar12 = image->img[uVar8][uVar4][uVar7] * (1.0 / max_value);
        fVar11 = fVar11 + fVar12;
        fVar10 = fVar10 + fVar12 * fVar12;
      }
      fVar10 = (fVar10 - fVar9 * (fVar11 / fVar9) * (fVar11 / fVar9)) / fVar9;
      if (fVar10 <= 0.0) {
        fVar10 = 0.0;
      }
      *pfVar5 = SQRT(fVar10) * *pfVar5;
      pfVar5 = pfVar5 + 1;
    }
  }
  return;
}

Assistant:

void mulSaturationWeight(ImageFloat &wp, const Image<T> &image, float max_value)
    {
      float scale=1.0f/max_value;
      int n=image.getDepth();

      float *p=wp.getPtr(0, 0, 0);
      for (long k=0; k<image.getHeight(); k++)
      {
        for (long i=0; i<image.getWidth(); i++)
        {
          float ssum=0;
          float mean=0;

          for (int d=0; d<n; d++)
          {
            float v=scale*image.get(i, k, d);
            ssum+=v*v;
            mean+=v;
          }

          mean/=n;

          // multiply standard deviation of color values

          *p++ *= static_cast<float>(std::sqrt(std::max(0.0f, (ssum-n*mean*mean)/n)));
        }
      }
    }